

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::PeelAvalancheOnSolve(Codec *this,uint16_t column_i)

{
  PeelColumn *pPVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t *puVar4;
  ushort in_SI;
  Codec *in_RDI;
  PeelColumn *ref_col;
  uint16_t ref_column_i;
  uint16_t store_count;
  PeelRowIterator ref_iter;
  uint16_t new_column_i;
  uint16_t unmarked_count;
  PeelRow *ref_row;
  uint16_t ref_row_i;
  uint16_t *ref_rows;
  uint16_t ref_row_count;
  PeelRefs *refs;
  uint16_t distanceToP;
  undefined1 *in_stack_ffffffffffffff50;
  PeelRow *in_stack_ffffffffffffff58;
  ushort local_88;
  undefined1 local_86 [28];
  ushort local_6a;
  uint16_t *local_68;
  uint16_t local_5a;
  PeelRefs *local_58;
  ushort local_4a;
  ushort local_3c;
  ushort local_3a;
  PeelRowParameters *local_38;
  PeelRow *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  char local_11;
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  undefined1 *local_8;
  
  local_58 = in_RDI->_peel_col_refs + in_SI;
  local_68 = local_58->Rows;
  local_5a = local_58->RowCount;
  local_4a = in_SI;
  while (uVar3 = local_5a - 1, local_5a != 0) {
    puVar4 = local_68 + 1;
    local_6a = *local_68;
    local_86._14_8_ = in_RDI->_peel_rows + local_6a;
    local_86._12_2_ = ((PeelRow *)local_86._14_8_)->UnmarkedCount - 1;
    ((PeelRow *)local_86._14_8_)->UnmarkedCount = local_86._12_2_;
    local_68 = puVar4;
    local_5a = uVar3;
    if (local_86._12_2_ == 1) {
      local_86._10_2_ = (((PeelRow *)local_86._14_8_)->Marks).Unmarked[0];
      if (local_86._10_2_ == local_4a) {
        local_86._10_2_ = (((PeelRow *)local_86._14_8_)->Marks).Unmarked[1];
      }
      if (in_RDI->_peel_cols[(ushort)local_86._10_2_].Mark == '\0') {
        SolveWithPeel(in_RDI,in_stack_ffffffffffffff58,
                      (uint16_t)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                      (uint16_t)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      }
      else {
        ((PeelRow *)local_86._14_8_)->NextRow = in_RDI->_defer_head_rows;
        in_RDI->_defer_head_rows = local_6a;
      }
    }
    else if (local_86._12_2_ == 2) {
      local_38 = &((PeelRow *)local_86._14_8_)->Params;
      local_3a = in_RDI->_block_count;
      local_3c = in_RDI->_block_next_prime;
      in_stack_ffffffffffffff58 = (PeelRow *)local_86;
      local_86._2_2_ = (((PeelRow *)local_86._14_8_)->Params).PeelFirst;
      local_86._0_2_ = local_38->PeelCount - 1;
      local_86._4_2_ = (((PeelRow *)local_86._14_8_)->Params).PeelAdd;
      local_88 = 0;
      local_86._12_2_ = 2;
      do {
        local_28 = local_86;
        pPVar1 = in_RDI->_peel_cols;
        if (pPVar1[(ushort)local_86._2_2_].Mark == '\0') {
          *(undefined2 *)((long)&((PeelRow *)local_86._14_8_)->Marks + (ulong)local_88 * 2) =
               local_86._2_2_;
          pPVar1[(ushort)local_86._2_2_].field_1.Weight2Refs =
               pPVar1[(ushort)local_86._2_2_].field_1.Weight2Refs + 1;
          local_88 = local_88 + 1;
        }
        in_stack_ffffffffffffff50 = local_86;
        if (local_86._0_2_ == 0) {
          local_11 = '\0';
        }
        else {
          local_86._0_2_ = local_86._0_2_ + -1;
          local_8 = local_86 + 2;
          uVar2 = (ushort)((ulong)((uint)(ushort)local_86._2_2_ + (uint)(ushort)local_86._4_2_) %
                          (ulong)(long)(int)(uint)local_3c);
          if (local_3a <= (ushort)local_86._2_2_) {
            local_10 = local_3c - local_86._2_2_;
            if ((ushort)local_86._4_2_ < local_10) {
              uVar2 = (ushort)(((uint)(ushort)local_86._4_2_ * 0x10000 - (uint)local_10) %
                              (uint)(ushort)local_86._4_2_);
            }
            else {
              uVar2 = local_86._4_2_ - local_10;
            }
          }
          local_86._2_2_ = uVar2;
          local_11 = '\x01';
          local_e = local_86._4_2_;
          local_c = local_3c;
          local_a = local_3a;
        }
      } while (local_11 != '\0');
      local_30 = in_stack_ffffffffffffff58;
      local_20 = in_stack_ffffffffffffff50;
      local_86._6_2_ = local_3a;
      local_86._8_2_ = local_3c;
      if (local_88 < 2) {
        ((PeelRow *)local_86._14_8_)->UnmarkedCount = 0;
        if (local_88 == 1) {
          SolveWithPeel(in_RDI,in_stack_ffffffffffffff58,
                        (uint16_t)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                        (uint16_t)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        }
        else {
          ((PeelRow *)local_86._14_8_)->NextRow = in_RDI->_defer_head_rows;
          in_RDI->_defer_head_rows = local_6a;
        }
      }
    }
  }
  return;
}

Assistant:

void Codec::PeelAvalancheOnSolve(
    uint16_t column_i ///< Column that was solved
)
{
    PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[column_i];
    uint16_t ref_row_count = refs->RowCount;
    uint16_t * GF256_RESTRICT ref_rows = refs->Rows;

    // Walk list of peeled rows referenced by this newly solved column
    while (ref_row_count--)
    {
        // Update unmarked row count for this referenced row
        uint16_t ref_row_i = *ref_rows++;
        PeelRow * GF256_RESTRICT ref_row = &_peel_rows[ref_row_i];
        uint16_t unmarked_count = --ref_row->UnmarkedCount;

        // If row may be solving a column now:
        if (unmarked_count == 1)
        {
            uint16_t new_column_i = ref_row->Marks.Unmarked[0];

            // If that is this column:
            if (new_column_i == column_i) {
                new_column_i = ref_row->Marks.Unmarked[1];
            }

            /*
                Rows that are to be deferred will either end up
                here or below where it handles the case of there
                being no columns unmarked in a row.
            */

            // If column is already solved:
            if (_peel_cols[new_column_i].Mark == MARK_TODO)
            {
                SolveWithPeel(
                    ref_row,
                    ref_row_i,
                    new_column_i);
                continue;
            }

            CAT_IF_DUMP(cout << "PeelAvalancheOnSolve: Deferred(1) with column " <<
                column_i << " at row " << ref_row_i << endl;)

            // Link at head of defer list
            ref_row->NextRow = _defer_head_rows;
            _defer_head_rows = ref_row_i;
        }
        else if (unmarked_count == 2)
        {
            // Regenerate the row columns to discover which are unmarked
            PeelRowIterator ref_iter(ref_row->Params, _block_count, _block_next_prime);

            uint16_t store_count = 0;

            // For each column:
            do
            {
                const uint16_t ref_column_i = ref_iter.GetColumn();

                PeelColumn * GF256_RESTRICT ref_col = &_peel_cols[ref_column_i];

                // If column is unmarked:
                if (ref_col->Mark == MARK_TODO)
                {
                    // Store the two unmarked columns in the row
                    ref_row->Marks.Unmarked[store_count++] = ref_column_i;

                    // Increment weight-2 reference count (cannot hurt even if not true)
                    ref_col->Weight2Refs++;
                }
            } while (ref_iter.Iterate());

            /*
                This is a little subtle, but sometimes the avalanche will
                happen here, and sometimes a row will be marked deferred.
            */

            if (store_count <= 1)
            {
                // Insure that this row won't be processed further during this recursion
                ref_row->UnmarkedCount = 0;

                // If row is to be deferred:
                if (store_count == 1)
                {
                    SolveWithPeel(
                        ref_row,
                        ref_row_i,
                        ref_row->Marks.Unmarked[0]);
                    continue;
                }

                CAT_IF_DUMP(cout << "PeelAvalancheOnSolve: Deferred(2) with column " << column_i << " at row " << ref_row_i << endl;)

                // Link at head of defer list
                ref_row->NextRow = _defer_head_rows;
                _defer_head_rows = ref_row_i;
            }
        }
    }
}